

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

Balk * __thiscall
Parser::get_balk_from_file(Balk *__return_storage_ptr__,Parser *this,string *file_name)

{
  istream *piVar1;
  double *pdVar2;
  ParseError *pPVar3;
  char type;
  int shift;
  double value;
  double segment_length;
  int balk_size;
  int shift_end;
  double J;
  double E;
  string line;
  stringstream stream;
  string local_3a8 [368];
  ifstream file;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&file,(string *)file_name,_S_in);
  if ((abStack_218[*(long *)(_file + -0x18)] & 5) != 0) {
    pPVar3 = (ParseError *)__cxa_allocate_exception(0x10);
    ParseError::runtime_error(pPVar3,"Cannot open Input file");
    __cxa_throw(pPVar3,&ParseError::typeinfo,std::runtime_error::~runtime_error);
  }
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&file,(string *)&line);
  std::__cxx11::stringstream::stringstream((stringstream *)&stream,(string *)&line,_S_out|_S_in);
  std::istream::operator>>((istream *)&stream,&balk_size);
  std::istream::_M_extract<double>((double *)&stream);
  piVar1 = std::istream::_M_extract<double>((double *)&stream);
  std::istream::_M_extract<double>((double *)piVar1);
  Balk::Balk(__return_storage_ptr__,balk_size,segment_length,E,J);
  do {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&file,(string *)&line);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) {
      std::ifstream::close();
      std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
      std::__cxx11::string::~string((string *)&line);
      std::ifstream::~ifstream(&file);
      return __return_storage_ptr__;
    }
    std::ios::clear((int)*(undefined8 *)(_stream + -0x18) + (int)(istream *)&stream);
    std::__cxx11::stringbuf::str(local_3a8);
    piVar1 = std::operator>>((istream *)&stream,&type);
    std::istream::operator>>(piVar1,&shift);
    switch(type) {
    case 'K':
      std::istream::_M_extract<double>((double *)&stream);
      Balk::add_elastic_support(__return_storage_ptr__,shift,segment_length,value);
      break;
    case 'L':
    case 'N':
    case 'O':
switchD_00106804_caseD_4c:
      pPVar3 = (ParseError *)__cxa_allocate_exception(0x10);
      ParseError::runtime_error(pPVar3,"Unknown term");
      __cxa_throw(pPVar3,&ParseError::typeinfo,std::runtime_error::~runtime_error);
    case 'M':
      std::istream::_M_extract<double>((double *)&stream);
      Balk::add_moment(__return_storage_ptr__,shift,segment_length,value);
      break;
    case 'P':
      std::istream::_M_extract<double>((double *)&stream);
      Balk::add_concentrated_power(__return_storage_ptr__,shift,segment_length,value);
      break;
    case 'Q':
      pdVar2 = (double *)std::istream::operator>>((istream *)&stream,&shift_end);
      std::istream::_M_extract<double>(pdVar2);
      Balk::add_uniform_load(__return_storage_ptr__,shift,segment_length,value);
      if (shift_end != balk_size) {
        Balk::add_uniform_load(__return_storage_ptr__,shift_end,segment_length,-value);
      }
      break;
    case 'R':
      Balk::add_hinge_support(__return_storage_ptr__,shift,segment_length);
      break;
    default:
      if (type != 'Z') goto switchD_00106804_caseD_4c;
      Balk::add_hard_pinching(__return_storage_ptr__,shift,segment_length);
    }
  } while( true );
}

Assistant:

Balk Parser::get_balk_from_file(const std::string &file_name)
{
    std::ifstream file{file_name};
    if (!file) {
        throw ParseError("Cannot open Input file");
    }

    std::string line;
    std::getline(file, line);
    std::stringstream stream(line);

    int balk_size;
    double segment_length;
    double E, J;
    stream >> balk_size;
    stream >> segment_length;
    stream >> E >> J;
    Balk balk(balk_size, segment_length, E, J);

    // Parse conditions
    while (std::getline(file, line))
    {
        stream.clear();
        stream.str(line);

        char type;
        int shift, shift_end;
        double value;

        // Read the type of expression
        stream >> type >> shift;

        switch (type)
        {
        case 'R':
            balk.add_hinge_support(shift, segment_length);
            break;
        case 'K':
            stream >> value;
            balk.add_elastic_support(shift, segment_length, value);
            break;

        case 'Z':
            balk.add_hard_pinching(shift, segment_length);
            break;

        case 'P':
            stream >> value;
            balk.add_concentrated_power(shift, segment_length, value);
            break;

        case 'M':
            stream >> value;
            balk.add_moment(shift, segment_length, value);
            break;

        case 'Q':
            stream >> shift_end >> value;
            balk.add_uniform_load(shift, segment_length, value);
            if (shift_end != balk_size)
            {
                balk.add_uniform_load(shift_end, segment_length, -value);
            }
            break;

        default:
            throw ParseError("Unknown term");
        }
    }
    file.close();
    return balk;
}